

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O3

void gdImageWBMPCtx(gdImagePtr image,int fg,gdIOCtx *out)

{
  int iVar1;
  int iVar2;
  Wbmp *wbmp;
  int iVar3;
  int y;
  long lVar4;
  
  wbmp = createwbmp(image->sx,image->sy,1);
  if (wbmp != (Wbmp *)0x0) {
    iVar2 = image->sy;
    if (0 < iVar2) {
      iVar1 = image->sx;
      iVar3 = 0;
      y = 0;
      do {
        if (0 < iVar1) {
          lVar4 = 0;
          do {
            iVar2 = gdImageGetPixel(image,(int)lVar4,y);
            if (iVar2 == fg) {
              wbmp->bitmap[iVar3 + lVar4] = 0;
            }
            iVar1 = image->sx;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 < iVar1);
          iVar3 = iVar3 + (int)lVar4;
          iVar2 = image->sy;
        }
        y = y + 1;
      } while (y < iVar2);
    }
    iVar2 = writewbmp(wbmp,gd_putout,out);
    if (iVar2 != 0) {
      gd_error("Could not save WBMP\n");
    }
    freewbmp(wbmp);
    return;
  }
  gd_error("Could not create WBMP\n");
  return;
}

Assistant:

BGD_DECLARE(void) gdImageWBMPCtx(gdImagePtr image, int fg, gdIOCtx *out)
{
	int x, y, pos;
	Wbmp *wbmp;

	/* create the WBMP */
	if((wbmp = createwbmp(gdImageSX(image), gdImageSY(image), WBMP_WHITE)) == NULL) {
		gd_error("Could not create WBMP\n");
		return;
	}

	/* fill up the WBMP structure */
	pos = 0;
	for(y = 0; y < gdImageSY(image); y++) {
		for(x = 0; x < gdImageSX(image); x++) {
			if(gdImageGetPixel(image, x, y) == fg) {
				wbmp->bitmap[pos] = WBMP_BLACK;
			}
			pos++;
		}
	}

	/* write the WBMP to a gd file descriptor */
	if(writewbmp(wbmp, &gd_putout, out)) {
		gd_error("Could not save WBMP\n");
	}

	/* des submitted this bugfix: gdFree the memory. */
	freewbmp(wbmp);
}